

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlep_writer.c
# Opt level: O2

void dlep_writer_start_signal(dlep_writer *writer,uint16_t signal_type)

{
  undefined8 in_RAX;
  undefined1 auStack_18 [6];
  ushort local_12;
  
  writer->signal_type = signal_type;
  writer->signal_start = writer->out->_len;
  auStack_18 = SUB86(in_RAX,0);
  _auStack_18 = CONCAT26(signal_type << 8 | signal_type >> 8,auStack_18);
  abuf_memcpy(writer->out,&local_12,2);
  auStack_18 = (undefined1  [6])CONCAT24(0,auStack_18._0_4_);
  abuf_memcpy(writer->out,auStack_18 + 4,2);
  return;
}

Assistant:

void
dlep_writer_start_signal(struct dlep_writer *writer, uint16_t signal_type) {
  writer->signal_type = signal_type;
  writer->signal_start = abuf_getlen(writer->out);

  abuf_append_uint16(writer->out, htons(signal_type));
  abuf_append_uint16(writer->out, 0);
}